

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

Point3f __thiscall pbrt::detail::Hammersley3DIter::operator*(Hammersley3DIter *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  Point3f PVar11;
  
  iVar1 = (this->super_IndexingIterator<pbrt::detail::Hammersley3DIter>).i;
  uVar3 = (ulong)iVar1;
  if (uVar3 == 0) {
    auVar7 = ZEXT816(0) << 0x40;
    auVar9 = ZEXT816(0) << 0x40;
  }
  else {
    lVar4 = 0;
    fVar6 = 1.0;
    uVar2 = uVar3;
    do {
      fVar6 = fVar6 * 0.5;
      lVar4 = (lVar4 - uVar2 / 2) * 2 + uVar2;
      bVar5 = 1 < uVar2;
      uVar2 = uVar2 / 2;
    } while (bVar5);
    auVar7 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,lVar4);
    lVar4 = 0;
    fVar8 = 1.0;
    do {
      fVar8 = fVar8 * 0.33333334;
      lVar4 = (lVar4 - uVar3 / 3) * 3 + uVar3;
      bVar5 = 2 < uVar3;
      uVar3 = uVar3 / 3;
    } while (bVar5);
    auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar6 * auVar7._0_4_)));
    auVar9 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,lVar4);
    auVar9 = ZEXT416((uint)(fVar8 * auVar9._0_4_));
  }
  auVar10._0_4_ =
       (float)iVar1 / (float)(this->super_IndexingIterator<pbrt::detail::Hammersley3DIter>).n;
  auVar10._4_12_ = in_ZMM3._4_12_;
  auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar9);
  auVar7 = vinsertps_avx(auVar10,auVar7,0x10);
  PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar7._0_8_;
  PVar11.super_Tuple3<pbrt::Point3,_float>.z = auVar9._0_4_;
  return (Point3f)PVar11.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Point3f operator*() {
        return {Float(i) / Float(n), RadicalInverse(0, i), RadicalInverse(1, i)};
    }